

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

void * __thiscall google::protobuf::DynamicMessage::MutableRaw(DynamicMessage *this,int i)

{
  uint uVar1;
  Type TVar2;
  uint uVar3;
  
  uVar1 = (this->type_info_->offsets)._M_t.
          super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
          super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[i];
  TVar2 = FieldDescriptor::type
                    ((FieldDescriptor *)((long)i * 0x48 + *(long *)(this->type_info_->type + 0x28)))
  ;
  uVar3 = uVar1 & 0xfffffffe;
  if (TVar2 != TYPE_MESSAGE) {
    uVar3 = uVar1;
  }
  return (void *)((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                 (long)(int)uVar3);
}

Assistant:

inline void* DynamicMessage::MutableRaw(int i) {
  return OffsetToPointer(
      OffsetValue(type_info_->offsets[i], type_info_->type->field(i)->type()));
}